

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[20],int,char_const(&)[6],kj::String&>
          (String *__return_storage_ptr__,kj *this,char (*params) [20],int *params_1,
          char (*params_2) [6],String *params_3)

{
  char (*value) [20];
  int *value_00;
  char (*value_01) [6];
  String *value_02;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  CappedArray<char,_14UL> local_58;
  ArrayPtr<const_char> local_40;
  String *local_30;
  String *params_local_3;
  char (*params_local_2) [6];
  int *params_local_1;
  char (*params_local) [20];
  
  local_30 = (String *)params_2;
  params_local_3 = (String *)params_1;
  params_local_2 = (char (*) [6])params;
  params_local_1 = (int *)this;
  params_local = (char (*) [20])__return_storage_ptr__;
  value = ::const((char (*) [20])this);
  local_40 = toCharSequence<char_const(&)[20]>(value);
  value_00 = fwd<int>((NoInfer<int> *)params_local_2);
  toCharSequence<int>(&local_58,value_00);
  value_01 = ::const((char (*) [6])params_local_3);
  local_68 = toCharSequence<char_const(&)[6]>(value_01);
  value_02 = fwd<kj::String&>(local_30);
  local_78 = toCharSequence<kj::String&>(value_02);
  _::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_40,(ArrayPtr<const_char> *)&local_58,
             (CappedArray<char,_14UL> *)&local_68,&local_78,(ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}